

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

bool __thiscall
soplex::SPxBasisBase<double>::readBasis
          (SPxBasisBase<double> *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  Status SVar4;
  int iVar5;
  uint i_00;
  uint i_01;
  Type TVar6;
  ostream *poVar7;
  SPxSolverBase<double> *pSVar8;
  double *pdVar9;
  char cVar10;
  byte bVar11;
  int i;
  long lVar12;
  int iVar13;
  NameSet *pNVar14;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  double local_400;
  DataKey key;
  NameSet *local_3f0;
  Desc l_desc;
  stringstream name;
  istream *local_380;
  undefined8 local_378;
  undefined2 local_370;
  char *local_268;
  char *pcStack_260;
  char *local_258;
  char *pcStack_250;
  char *local_248;
  char *pcStack_240;
  char local_238;
  char local_138;
  undefined2 local_38;
  int local_34;
  
  p_colNames = (NameSet *)0x0;
  p_rowNames = (NameSet *)0x0;
  local_3f0 = colNames;
  if (colNames == (NameSet *)0x0) {
    iVar5 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)&name);
    spx_alloc<soplex::NameSet*>(&p_colNames,1);
    pNVar14 = p_colNames;
    NameSet::NameSet(p_colNames,10000,-1,2.0,2.0);
    p_colNames = pNVar14;
    NameSet::reMax(pNVar14,iVar5);
    iVar13 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar5 != iVar13; iVar13 = iVar13 + 1) {
      poVar7 = std::operator<<((ostream *)&local_380,"x");
      std::ostream::operator<<((ostream *)poVar7,iVar13);
      key = (DataKey)SPxLPBase<double>::cId(&this->theLP->super_SPxLPBase<double>,iVar13);
      pNVar14 = p_colNames;
      std::__cxx11::stringbuf::str();
      NameSet::add(pNVar14,&key,(char *)l_desc.rowstat._0_8_);
      std::__cxx11::string::~string((string *)&l_desc);
    }
    local_3f0 = p_colNames;
    std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  }
  pNVar14 = rowNames;
  if (rowNames == (NameSet *)0x0) {
    iVar5 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
            super_SVSetBase<double>.set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)&name);
    spx_alloc<soplex::NameSet*>(&p_rowNames,1);
    pNVar14 = p_rowNames;
    NameSet::NameSet(p_rowNames,10000,-1,2.0,2.0);
    p_rowNames = pNVar14;
    NameSet::reMax(pNVar14,iVar5);
    iVar13 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; pNVar14 = p_rowNames, iVar5 != iVar13; iVar13 = iVar13 + 1) {
      poVar7 = std::operator<<((ostream *)&local_380,"C");
      std::ostream::operator<<((ostream *)poVar7,iVar13);
      key = (DataKey)SPxLPBase<double>::rId(&this->theLP->super_SPxLPBase<double>,iVar13);
      pNVar14 = p_rowNames;
      std::__cxx11::stringbuf::str();
      NameSet::add(pNVar14,&key,(char *)l_desc.rowstat._0_8_);
      std::__cxx11::string::~string((string *)&l_desc);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&name);
  }
  if (this->thestatus == NO_PROBLEM) {
    (*this->_vptr_SPxBasisBase[7])(this,this->theLP,0);
  }
  Desc::Desc(&l_desc,&this->thedesc);
  for (lVar12 = 0; pSVar8 = this->theLP,
      lVar12 < (pSVar8->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
               set.thenum; lVar12 = lVar12 + 1) {
    SVar4 = dualRowStatus(this,(int)lVar12);
    l_desc.rowstat.data[lVar12] = SVar4;
  }
  for (lVar12 = 0;
      lVar12 < (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum; lVar12 = lVar12 + 1) {
    dVar1 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar12];
    pdVar9 = (pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + lVar12;
    if ((dVar1 != *pdVar9) || (NAN(dVar1) || NAN(*pdVar9))) {
      local_400 = dVar1;
      pdVar9 = (double *)infinity();
      if (local_400 <= -*pdVar9) {
        local_400 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar12];
        pdVar9 = (double *)infinity();
        if (*pdVar9 <= local_400) {
          l_desc.colstat.data[lVar12] = P_FREE;
          goto LAB_00191b99;
        }
      }
      local_400 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
      pdVar9 = (double *)infinity();
      if (local_400 <= -*pdVar9) {
        l_desc.colstat.data[lVar12] = P_ON_UPPER;
      }
      else {
        l_desc.colstat.data[lVar12] = P_ON_LOWER;
      }
    }
    else {
      l_desc.colstat.data[lVar12] = P_FIXED;
    }
LAB_00191b99:
    pSVar8 = this->theLP;
  }
  _name = &PTR__MPSInput_0053cf70;
  bVar2 = false;
  local_378._0_4_ = 0;
  local_378._4_4_ = MINIMIZE;
  local_370._0_1_ = false;
  local_370._1_1_ = '\0';
  local_38._0_1_ = false;
  local_38._1_1_ = false;
  local_34 = 0;
  local_138 = '\0';
  local_268 = (char *)0x0;
  pcStack_260 = (char *)0x0;
  local_258 = (char *)0x0;
  pcStack_250 = (char *)0x0;
  local_248 = (char *)0x0;
  pcStack_240 = (char *)0x0;
  local_238 = '\0';
  local_380 = is;
  bVar3 = MPSInput::readLine((MPSInput *)&name);
  if (((bVar3) && (local_268 != (char *)0x0)) && (iVar5 = strcmp(local_268,"NAME"), iVar5 == 0)) {
    while (bVar3 = MPSInput::readLine((MPSInput *)&name), bVar3) {
      if ((local_268 != (char *)0x0) && (iVar5 = strcmp(local_268,"ENDATA"), iVar5 == 0)) {
        bVar2 = true;
        break;
      }
      if (((pcStack_260 == (char *)0x0) || (local_258 == (char *)0x0)) ||
         (i_00 = NameSet::number(local_3f0,local_258), (int)i_00 < 0)) break;
      cVar10 = *pcStack_260;
      if (cVar10 == 'X') {
        if ((pcStack_250 == (char *)0x0) ||
           (i_01 = NameSet::number(pNVar14,pcStack_250), (int)i_01 < 0)) break;
        cVar10 = *pcStack_260;
        if (cVar10 != 'X') goto LAB_00191e1b;
        if ((pcStack_260[1] == 'U') && (pcStack_260[2] == '\0')) {
          SVar4 = dualColStatus(this,i_00);
          l_desc.colstat.data[i_00] = SVar4;
          TVar6 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i_01);
          if (TVar6 == GREATER_EQUAL) {
            l_desc.rowstat.data[i_01] = P_ON_LOWER;
          }
          else {
            TVar6 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i_01);
            if (TVar6 == EQUAL) {
LAB_00191e0e:
              l_desc.rowstat.data[i_01] = P_FIXED;
            }
            else {
              l_desc.rowstat.data[i_01] = P_ON_UPPER;
            }
          }
        }
        else {
          if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) {
LAB_00191f74:
            MPSInput::syntaxError((MPSInput *)&name);
            break;
          }
          SVar4 = dualColStatus(this,i_00);
          l_desc.colstat.data[i_00] = SVar4;
          TVar6 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i_01);
          if (TVar6 == LESS_EQUAL) {
            l_desc.rowstat.data[i_01] = P_ON_UPPER;
          }
          else {
            TVar6 = LPRowSetBase<double>::type((LPRowSetBase<double> *)this->theLP,i_01);
            if (TVar6 == EQUAL) goto LAB_00191e0e;
            l_desc.rowstat.data[i_01] = P_ON_LOWER;
          }
        }
      }
      else {
LAB_00191e1b:
        if (cVar10 == 'L') {
          if ((pcStack_260[1] != 'L') || (pcStack_260[2] != '\0')) goto LAB_00191f74;
          l_desc.colstat.data[i_00] = P_ON_LOWER;
        }
        else {
          if (((cVar10 != 'U') || (pcStack_260[1] != 'L')) || (pcStack_260[2] != '\0'))
          goto LAB_00191f74;
          l_desc.colstat.data[i_00] = P_ON_UPPER;
        }
      }
    }
  }
  if (local_370._0_1_ == false) {
    if (bVar2) {
      if (this->thestatus != REGULAR) {
        this->thestatus = REGULAR;
      }
      (*this->_vptr_SPxBasisBase[5])(this,&l_desc);
    }
    else {
      MPSInput::syntaxError((MPSInput *)&name);
    }
  }
  if (rowNames == (NameSet *)0x0) {
    NameSet::~NameSet(p_rowNames);
    free(p_rowNames);
    p_rowNames = (NameSet *)0x0;
  }
  if (colNames == (NameSet *)0x0) {
    NameSet::~NameSet(p_colNames);
    free(p_colNames);
    p_colNames = (NameSet *)0x0;
  }
  bVar11 = local_370._0_1_ ^ 1;
  Desc::~Desc(&l_desc);
  return (bool)bVar11;
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}